

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_10cf415::HandleStringsCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pcVar1;
  size_type sVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  string *psVar9;
  undefined8 uVar10;
  ulong uVar11;
  uint *puVar12;
  ulong uVar13;
  undefined1 uVar14;
  pointer pbVar15;
  pointer pbVar16;
  ulong uVar17;
  BOM BVar18;
  uint uVar19;
  pointer pbVar20;
  char cVar21;
  pointer pbVar22;
  undefined4 uVar23;
  size_type sVar24;
  undefined4 uVar25;
  int iVar26;
  string *sr;
  ulong uVar27;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string_view value;
  string output;
  int limit_output;
  int limit_input;
  string s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  string fileName;
  ifstream fin;
  RegularExpression regex;
  string local_400;
  BOM local_3dc;
  cmExecutionStatus *local_3d8;
  int local_3cc;
  uint local_3c8;
  uint local_3c4;
  ulong local_3c0;
  uint local_3b8;
  int local_3b4;
  undefined8 local_3b0;
  undefined1 local_3a8 [32];
  char local_388 [8];
  char *local_380;
  ulong local_378;
  pointer local_370;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  ulong local_348;
  string local_340;
  pointer local_320;
  ulong local_318;
  pointer local_310;
  undefined1 local_308 [32];
  size_type local_2e8;
  pointer local_2e0;
  RegularExpression local_100;
  
  pbVar16 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_3d8 = status;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar16) < 0x41) {
    local_308._0_8_ = local_308 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_308,"STRINGS requires a file name and output variable","");
    std::__cxx11::string::_M_assign((string *)&local_3d8->Error);
    if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
      operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
    }
    return (bool)0;
  }
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  pcVar1 = pbVar16[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_340,pcVar1,pcVar1 + pbVar16[1]._M_string_length);
  bVar4 = cmsys::SystemTools::FileIsFullPath(&local_340);
  if (!bVar4) {
    psVar9 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(local_3d8->Makefile);
    local_308._8_8_ = (psVar9->_M_dataplus)._M_p;
    local_308._0_8_ = psVar9->_M_string_length;
    local_308._24_8_ = local_100.regmatch.startp + 2;
    local_100.regmatch.startp[0] = (char *)0x1;
    local_100.regmatch.startp[2]._0_1_ = 0x2f;
    pbVar16 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_308._16_8_ = 1;
    local_2e0 = pbVar16[1]._M_dataplus._M_p;
    local_2e8 = pbVar16[1]._M_string_length;
    views._M_len = 3;
    views._M_array = (iterator)local_308;
    local_100.regmatch.startp[1] = (char *)local_308._24_8_;
    cmCatViews_abi_cxx11_((string *)local_3a8,views);
    std::__cxx11::string::operator=((string *)&local_340,(string *)local_3a8);
    if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
      operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
    }
  }
  pbVar16 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_3b4 = -1;
  local_3cc = -1;
  local_100.regmust = (char *)0x0;
  local_370 = (pointer)0x0;
  local_100.program = (char *)0x0;
  local_100.progsize = 0;
  memset(&local_100,0,0xaa);
  uVar7 = local_3b0._4_4_;
  local_3c8 = 0;
  local_3b0 = (pointer)((ulong)local_3b0._4_4_ << 0x20);
  local_348 = 0;
  uVar13 = 0;
  BVar18 = BOM_None;
  local_320 = pbVar16;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar16) < 0x61) {
LAB_0034c522:
    psVar9 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_3d8->Makefile);
    local_308._8_8_ = (psVar9->_M_dataplus)._M_p;
    local_308._0_8_ = psVar9->_M_string_length;
    local_308._16_8_ = 0x28;
    local_308._24_8_ = "/CMakeFiles/FileCommandStringsBinaryFile";
    views_00._M_len = 2;
    views_00._M_array = (iterator)local_308;
    cmCatViews_abi_cxx11_((string *)local_3a8,views_00);
    bVar4 = cmHexFileConverter::TryConvert(&local_340,(string *)local_3a8);
    if (bVar4) {
      std::__cxx11::string::_M_assign((string *)&local_340);
    }
    if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
      operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
    }
  }
  else {
    bVar4 = true;
    local_3c4 = 0;
    local_3c8 = 0;
    local_3b0 = (pointer)((ulong)uVar7 << 0x20);
    local_378 = 0;
    local_348 = 0;
    uVar23 = 0;
    local_3dc = BOM_None;
    pbVar20 = (pointer)0x3;
    pbVar22 = pbVar16;
    do {
      pbVar15 = (pointer)(ulong)((int)pbVar20 + 1);
      while( true ) {
        pbVar16 = pbVar15;
        iVar6 = std::__cxx11::string::compare((char *)(pbVar22 + (long)pbVar20));
        if (iVar6 == 0) break;
        iVar6 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + (long)pbVar20));
        if (iVar6 == 0) {
          uVar23 = 2;
          uVar7 = local_3c4;
          goto LAB_0034c2ee;
        }
        iVar6 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + (long)pbVar20));
        if (iVar6 == 0) {
          uVar23 = 3;
          uVar7 = local_3c4;
          goto LAB_0034c2ee;
        }
        iVar6 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + (long)pbVar20));
        if (iVar6 == 0) {
          uVar23 = 4;
          uVar7 = local_3c4;
          goto LAB_0034c2ee;
        }
        iVar6 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + (long)pbVar20));
        if (iVar6 == 0) {
          uVar23 = 5;
          uVar7 = local_3c4;
          goto LAB_0034c2ee;
        }
        iVar6 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + (long)pbVar20));
        if (iVar6 == 0) {
          uVar23 = 7;
          uVar7 = local_3c4;
          goto LAB_0034c2ee;
        }
        uVar10 = std::__cxx11::string::compare
                           ((char *)((args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + (long)pbVar20));
        uVar25 = 0;
        if ((int)uVar10 == 0) {
          local_348 = CONCAT71((int7)((ulong)uVar10 >> 8),1);
          uVar23 = 0;
          uVar7 = local_3c4;
          goto LAB_0034c2ee;
        }
        iVar6 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + (long)pbVar20));
        if (iVar6 != 0) {
          iVar6 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + (long)pbVar20));
          if (iVar6 == 0) {
            uVar23 = 8;
            uVar7 = local_3c4;
            goto LAB_0034c2ee;
          }
          puVar12 = &switchD_0034c2b4::switchdataD_0076dafc;
          switch(uVar23) {
          case 1:
            iVar6 = __isoc99_sscanf((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[(long)pbVar20].
                                    _M_dataplus._M_p,"%d",&local_3b4);
            if ((iVar6 == 1) && (uVar23 = 0, uVar7 = local_3c4, -1 < local_3b4)) goto LAB_0034c2ee;
            local_308._0_8_ = 0x22;
            local_308._8_8_ = "STRINGS option LIMIT_INPUT value \"";
            pbVar16 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_3a8._8_8_ = pbVar16[(long)pbVar20]._M_dataplus._M_p;
            local_3a8._0_8_ = pbVar16[(long)pbVar20]._M_string_length;
            cmStrCat<char[30]>(&local_400,(cmAlphaNum *)local_308,(cmAlphaNum *)local_3a8,
                               (char (*) [30])"\" is not an unsigned integer.");
            std::__cxx11::string::_M_assign((string *)&local_3d8->Error);
            break;
          case 2:
            iVar6 = __isoc99_sscanf((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[(long)pbVar20].
                                    _M_dataplus._M_p,"%d",&local_3cc);
            if ((iVar6 == 1) && (uVar23 = 0, uVar7 = local_3c4, -1 < local_3cc)) goto LAB_0034c2ee;
            local_308._0_8_ = 0x23;
            local_308._8_8_ = "STRINGS option LIMIT_OUTPUT value \"";
            pbVar16 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_3a8._8_8_ = pbVar16[(long)pbVar20]._M_dataplus._M_p;
            local_3a8._0_8_ = pbVar16[(long)pbVar20]._M_string_length;
            cmStrCat<char[30]>(&local_400,(cmAlphaNum *)local_308,(cmAlphaNum *)local_3a8,
                               (char (*) [30])"\" is not an unsigned integer.");
            std::__cxx11::string::_M_assign((string *)&local_3d8->Error);
            break;
          case 3:
            iVar6 = __isoc99_sscanf((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[(long)pbVar20].
                                    _M_dataplus._M_p,"%d",&local_368);
            if (iVar6 == 1) {
              local_3b0 = (pointer)CONCAT44(local_3b0._4_4_,
                                            (uint)local_368.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
              uVar23 = uVar25;
              uVar7 = local_3c4;
              if (-1 < (int)(uint)local_368.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) goto LAB_0034c2ee;
            }
            local_308._0_8_ = 0x22;
            local_308._8_8_ = "STRINGS option LIMIT_COUNT value \"";
            pbVar16 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_3a8._8_8_ = pbVar16[(long)pbVar20]._M_dataplus._M_p;
            local_3a8._0_8_ = pbVar16[(long)pbVar20]._M_string_length;
            cmStrCat<char[30]>(&local_400,(cmAlphaNum *)local_308,(cmAlphaNum *)local_3a8,
                               (char (*) [30])"\" is not an unsigned integer.");
            std::__cxx11::string::_M_assign((string *)&local_3d8->Error);
            break;
          case 4:
            iVar6 = __isoc99_sscanf((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[(long)pbVar20].
                                    _M_dataplus._M_p,"%d",&local_368);
            if (iVar6 == 1) {
              uVar23 = uVar25;
              uVar7 = (uint)local_368.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              if (-1 < (int)(uint)local_368.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) goto LAB_0034c2ee;
            }
            local_308._0_8_ = 0x25;
            local_308._8_8_ = "STRINGS option LENGTH_MINIMUM value \"";
            pbVar16 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_3a8._8_8_ = pbVar16[(long)pbVar20]._M_dataplus._M_p;
            local_3a8._0_8_ = pbVar16[(long)pbVar20]._M_string_length;
            cmStrCat<char[30]>(&local_400,(cmAlphaNum *)local_308,(cmAlphaNum *)local_3a8,
                               (char (*) [30])"\" is not an unsigned integer.");
            std::__cxx11::string::_M_assign((string *)&local_3d8->Error);
            break;
          case 5:
            iVar6 = __isoc99_sscanf((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[(long)pbVar20].
                                    _M_dataplus._M_p,"%d",&local_368);
            if (iVar6 == 1) {
              local_3c8 = (uint)local_368.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
              uVar23 = uVar25;
              uVar7 = local_3c4;
              if (-1 < (int)(uint)local_368.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) goto LAB_0034c2ee;
            }
            local_308._0_8_ = 0x25;
            local_308._8_8_ = "STRINGS option LENGTH_MAXIMUM value \"";
            pbVar16 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_3a8._8_8_ = pbVar16[(long)pbVar20]._M_dataplus._M_p;
            local_3a8._0_8_ = pbVar16[(long)pbVar20]._M_string_length;
            cmStrCat<char[30]>(&local_400,(cmAlphaNum *)local_308,(cmAlphaNum *)local_3a8,
                               (char (*) [30])"\" is not an unsigned integer.");
            std::__cxx11::string::_M_assign((string *)&local_3d8->Error);
            break;
          default:
            local_308._0_8_ = 0x20;
            local_308._8_8_ = "STRINGS given unknown argument \"";
            pbVar16 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_3a8._8_8_ = pbVar16[(long)pbVar20]._M_dataplus._M_p;
            local_3a8._0_8_ = pbVar16[(long)pbVar20]._M_string_length;
            cmStrCat<char[2]>(&local_400,(cmAlphaNum *)local_308,(cmAlphaNum *)local_3a8,
                              (char (*) [2])0x78a212);
            std::__cxx11::string::_M_assign((string *)&local_3d8->Error);
            break;
          case 7:
            bVar5 = cmsys::RegularExpression::compile
                              (&local_100,
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[(long)pbVar20]._M_dataplus
                               ._M_p);
            local_378 = CONCAT71((int7)((ulong)puVar12 >> 8),1);
            uVar23 = uVar25;
            uVar7 = local_3c4;
            if (bVar5) goto LAB_0034c2ee;
            local_308._0_8_ = 0x1c;
            local_308._8_8_ = "STRINGS option REGEX value \"";
            pbVar16 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_3a8._8_8_ = pbVar16[(long)pbVar20]._M_dataplus._M_p;
            local_3a8._0_8_ = pbVar16[(long)pbVar20]._M_string_length;
            cmStrCat<char[25]>(&local_400,(cmAlphaNum *)local_308,(cmAlphaNum *)local_3a8,
                               (char (*) [25])"\" could not be compiled.");
            std::__cxx11::string::_M_assign((string *)&local_3d8->Error);
            break;
          case 8:
            iVar6 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + (long)pbVar20))
            ;
            if (iVar6 == 0) {
              local_3dc = BOM_UTF8;
              uVar23 = uVar25;
              uVar7 = local_3c4;
              goto LAB_0034c2ee;
            }
            iVar6 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + (long)pbVar20))
            ;
            if (iVar6 == 0) {
              local_3dc = BOM_UTF16LE;
              uVar23 = uVar25;
              uVar7 = local_3c4;
              goto LAB_0034c2ee;
            }
            iVar6 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + (long)pbVar20))
            ;
            if (iVar6 == 0) {
              local_3dc = BOM_UTF16BE;
              uVar23 = uVar25;
              uVar7 = local_3c4;
              goto LAB_0034c2ee;
            }
            iVar6 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + (long)pbVar20))
            ;
            if (iVar6 == 0) {
              local_3dc = BOM_UTF32LE;
              uVar23 = uVar25;
              uVar7 = local_3c4;
              goto LAB_0034c2ee;
            }
            iVar6 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + (long)pbVar20))
            ;
            local_3dc = BOM_UTF32BE;
            uVar23 = 0;
            uVar7 = local_3c4;
            if (iVar6 == 0) goto LAB_0034c2ee;
            local_308._0_8_ = 0x19;
            local_308._8_8_ = "STRINGS option ENCODING \"";
            pbVar16 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_3a8._8_8_ = pbVar16[(long)pbVar20]._M_dataplus._M_p;
            local_3a8._0_8_ = pbVar16[(long)pbVar20]._M_string_length;
            cmStrCat<char[18]>(&local_400,(cmAlphaNum *)local_308,(cmAlphaNum *)local_3a8,
                               (char (*) [18])"\" not recognized.");
            std::__cxx11::string::_M_assign((string *)&local_3d8->Error);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_400._M_dataplus._M_p != &local_400.field_2) {
            operator_delete(local_400._M_dataplus._M_p,
                            CONCAT71(local_400.field_2._M_allocated_capacity._1_7_,
                                     local_400.field_2._M_local_buf[0]) + 1);
          }
          uVar14 = 0;
          goto LAB_0034ccb5;
        }
        pbVar22 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar15 = (pointer)(ulong)((int)pbVar16 + 1);
        uVar23 = 0;
        bVar4 = false;
        pbVar20 = pbVar16;
        if ((pointer)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar22 >> 5) <=
            pbVar16) {
          local_370 = (pointer)(ulong)local_3c4;
          pbVar16 = pbVar15;
          uVar13 = local_378;
          BVar18 = local_3dc;
          goto LAB_0034c5aa;
        }
      }
      uVar23 = 1;
      uVar7 = local_3c4;
LAB_0034c2ee:
      local_3c4 = uVar7;
      pbVar22 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar20 = pbVar16;
    } while (pbVar16 < (pointer)((long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar22
                                >> 5));
    local_370 = (pointer)(ulong)local_3c4;
    uVar13 = local_378;
    BVar18 = local_3dc;
    if (bVar4) goto LAB_0034c522;
  }
LAB_0034c5aa:
  std::ifstream::ifstream(local_308,local_340._M_dataplus._M_p,_S_in);
  uVar27 = local_348;
  bVar4 = (*(byte *)((long)&local_2e8 + *(long *)(local_308._0_8_ - 0x18)) & 5) == 0;
  uVar17 = CONCAT71((int7)((ulong)pbVar16 >> 8),bVar4);
  if (!bVar4) {
    local_3a8._0_8_ = (char *)0xe;
    local_3a8._8_8_ = "STRINGS file \"";
    local_3a8._16_8_ = local_340._M_string_length;
    local_3a8._24_8_ = local_340._M_dataplus._M_p;
    local_388[0] = '\x11';
    local_388[1] = '\0';
    local_388[2] = '\0';
    local_388[3] = '\0';
    local_388[4] = '\0';
    local_388[5] = '\0';
    local_388[6] = '\0';
    local_388[7] = '\0';
    local_380 = "\" cannot be read.";
    views_01._M_len = 3;
    views_01._M_array = (iterator)local_3a8;
    cmCatViews_abi_cxx11_(&local_400,views_01);
    std::__cxx11::string::_M_assign((string *)&local_3d8->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,
                      CONCAT71(local_400.field_2._M_allocated_capacity._1_7_,
                               local_400.field_2._M_local_buf[0]) + 1);
    }
    goto LAB_0034cca8;
  }
  local_3b8 = (uint)uVar17;
  local_3dc = cmsys::FStream::ReadBOM((istream *)local_308);
  local_320 = local_320 + 2;
  if (local_3dc == BOM_None) {
    local_3dc = BVar18;
  }
  if (BVar18 != BOM_None) {
    local_3dc = BVar18;
  }
  local_3c4 = 3;
  if ((local_3dc & ~BOM_UTF8) != BOM_UTF32BE) {
    local_3c4 = (uint)((local_3dc & ~BOM_UTF8) == BOM_UTF16BE);
  }
  local_368.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3a8._0_8_ = local_3a8 + 0x10;
  local_3a8._8_8_ = (pointer)0x0;
  local_3a8._16_8_ = local_3a8._16_8_ & 0xffffffffffffff00;
  local_318 = (ulong)local_3b0 & 0xffffffff;
  local_310 = (pointer)(ulong)local_3c8;
  local_3c0 = 0;
  local_378 = uVar13;
  do {
    if (((int)local_3b0 != 0) &&
       (uVar11 = (long)local_368.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_368.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5, local_318 <= uVar11))
    goto LAB_0034cb33;
    if (((-1 < local_3b4) && (iVar6 = std::istream::tellg(), local_3b4 <= iVar6)) ||
       ((*(byte *)((long)&local_2e8 + *(long *)(local_308._0_8_ - 0x18)) & 5) != 0)) break;
    local_400._M_string_length = 0;
    local_400.field_2._M_local_buf[0] = '\0';
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    uVar7 = std::istream::get();
    cVar21 = (char)local_308;
    for (uVar19 = local_3c4; uVar19 != 0; uVar19 = uVar19 - 1) {
      uVar8 = std::istream::get();
      if ((*(byte *)((long)&local_2e8 + *(long *)(local_308._0_8_ - 0x18)) & 5) != 0) {
        std::istream::putback(cVar21);
        break;
      }
      uVar7 = uVar7 << 8 | uVar8;
    }
    if (local_3dc == BOM_UTF32LE) {
      uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    }
    else if (local_3dc == BOM_UTF16LE) {
      uVar7 = (uint)(ushort)((ushort)uVar7 << 8 | (ushort)uVar7 >> 8);
    }
    if (uVar7 == 0xd) {
      bVar4 = false;
    }
    else {
      if (uVar7 < 0x100) {
        iVar6 = isprint(uVar7);
        if (((uVar7 != 9) && (iVar6 == 0)) && ((uVar7 == 10 & (byte)uVar27) == 0))
        goto LAB_0034c829;
        std::__cxx11::string::push_back('\0');
      }
      else {
LAB_0034c829:
        if (local_3dc == BOM_UTF8) {
          uVar13 = 0;
          iVar6 = 2;
          do {
            iVar26 = iVar6;
            uVar19 = HandleStringsCommand::utf8_check_table[uVar13][0] & uVar7;
            uVar27 = uVar13 + 1;
            uVar8 = (uint)HandleStringsCommand::utf8_check_table[uVar13][1];
            if (uVar19 == uVar8) break;
            bVar4 = uVar13 < 2;
            uVar13 = uVar27;
            iVar6 = iVar26 + 1;
          } while (bVar4);
          uVar3 = (int)uVar27 + 1;
          if (uVar19 != uVar8) {
            uVar3 = 0;
          }
          if (uVar19 == uVar8) {
            iVar6 = 0;
            do {
              bVar4 = iVar6 != 0;
              iVar6 = iVar6 + -1;
              if ((bVar4) &&
                 ((uVar7 = std::istream::get(), (uVar7 & 0xc0) != 0x80 ||
                  ((*(uint *)((long)&local_2e8 + *(long *)(local_308._0_8_ - 0x18)) & 5) != 0)))) {
                std::istream::putback(cVar21);
                break;
              }
              std::__cxx11::string::push_back('\0');
              iVar26 = iVar26 + -1;
            } while (iVar26 != 0);
          }
          uVar27 = local_348;
          uVar13 = local_378;
          if (local_400._M_string_length != uVar3) {
            if (local_400._M_string_length != 1) {
              uVar17 = 1;
              do {
                std::istream::putback(cVar21);
                bVar4 = uVar17 < local_400._M_string_length - 1;
                uVar17 = (ulong)((int)uVar17 + 1);
              } while (bVar4);
            }
            local_400._M_string_length = 0;
            *local_400._M_dataplus._M_p = '\0';
          }
        }
      }
      if (uVar7 == 10 && (uVar27 & 1) == 0) {
        if (((ulong)local_3a8._8_8_ < local_370) ||
           (((uVar13 & 1) != 0 &&
            (bVar4 = cmsys::RegularExpression::find
                               (&local_100,(char *)local_3a8._0_8_,&local_100.regmatch), !bVar4))))
        {
LAB_0034ca5b:
          local_3a8._8_8_ = (pointer)0x0;
          *(char *)local_3a8._0_8_ = '\0';
          goto LAB_0034ca6c;
        }
        uVar7 = (int)local_3c0 + (int)local_3a8._8_8_ + 1;
        local_3c0 = (ulong)uVar7;
        if ((local_3cc < 0) || (bVar4 = true, (int)uVar7 < local_3cc)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_368,(value_type *)local_3a8);
          goto LAB_0034ca5b;
        }
      }
      else {
        if (local_400._M_string_length == 0) {
          if (((pointer)local_3a8._8_8_ != (pointer)0x0 && local_370 <= (ulong)local_3a8._8_8_) &&
             (((uVar13 & 1) == 0 ||
              (bVar4 = cmsys::RegularExpression::find
                                 (&local_100,(char *)local_3a8._0_8_,&local_100.regmatch), bVar4))))
          {
            uVar7 = (int)local_3c0 + (int)local_3a8._8_8_ + 1;
            local_3c0 = (ulong)uVar7;
            if ((-1 < local_3cc) && (bVar4 = true, local_3cc <= (int)uVar7)) goto LAB_0034cae8;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_368,(value_type *)local_3a8);
          }
          goto LAB_0034ca5b;
        }
        std::__cxx11::string::_M_append(local_3a8,(ulong)local_400._M_dataplus._M_p);
LAB_0034ca6c:
        bVar4 = false;
        if ((local_3c8 == 0) || ((pointer)local_3a8._8_8_ != local_310)) goto LAB_0034caf9;
        if ((uint)local_370 <= (uint)local_310) {
          uVar7 = local_3c8;
          if ((uVar13 & 1) != 0) {
            bVar4 = cmsys::RegularExpression::find
                              (&local_100,(char *)local_3a8._0_8_,&local_100.regmatch);
            if (!bVar4) goto LAB_0034cae6;
            uVar7 = local_3a8._8_4_;
          }
          uVar7 = (int)local_3c0 + uVar7 + 1;
          local_3c0 = (ulong)uVar7;
          if ((-1 < local_3cc) && (bVar4 = true, local_3cc <= (int)uVar7)) goto LAB_0034cae8;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_368,(value_type *)local_3a8);
        }
LAB_0034cae6:
        bVar4 = false;
      }
LAB_0034cae8:
      local_3a8._8_8_ = (pointer)0x0;
      *(char *)local_3a8._0_8_ = '\0';
    }
LAB_0034caf9:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,
                      CONCAT71(local_400.field_2._M_allocated_capacity._1_7_,
                               local_400.field_2._M_local_buf[0]) + 1);
    }
  } while (!bVar4);
  if ((int)local_3b0 == 0) {
    uVar17 = (ulong)local_3b8;
    iVar6 = (int)local_3c0;
LAB_0034cb51:
    if (((((pointer)local_3a8._8_8_ != (pointer)0x0) && (local_370 <= (ulong)local_3a8._8_8_)) &&
        (((uVar13 & 1) == 0 ||
         (bVar4 = cmsys::RegularExpression::find
                            (&local_100,(char *)local_3a8._0_8_,&local_100.regmatch), bVar4)))) &&
       ((local_3cc < 0 || (local_3a8._8_4_ + iVar6 + 1 < local_3cc)))) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_368,(value_type *)local_3a8);
    }
  }
  else {
    uVar11 = (long)local_368.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_368.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
LAB_0034cb33:
    uVar17 = (ulong)local_3b8;
    iVar6 = (int)local_3c0;
    if (uVar11 < local_318) goto LAB_0034cb51;
  }
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  local_400._M_string_length = 0;
  local_400.field_2._M_local_buf[0] = '\0';
  local_3b0 = local_368.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_368.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_368.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar16 = local_368.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::__cxx11::string::append((char *)&local_400);
      sVar2 = pbVar16->_M_string_length;
      if (sVar2 != 0) {
        pcVar1 = (pbVar16->_M_dataplus)._M_p;
        sVar24 = 0;
        do {
          if (pcVar1[sVar24] == ';') {
            std::__cxx11::string::push_back('\0');
          }
          std::__cxx11::string::push_back('\0');
          sVar24 = sVar24 + 1;
        } while (sVar2 != sVar24);
      }
      pbVar16 = pbVar16 + 1;
    } while (pbVar16 != local_3b0);
    uVar17 = (ulong)local_3b8;
  }
  value._M_str = local_400._M_dataplus._M_p;
  value._M_len = local_400._M_string_length;
  cmMakefile::AddDefinition(local_3d8->Makefile,local_320,value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,
                    CONCAT71(local_400.field_2._M_allocated_capacity._1_7_,
                             local_400.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
    operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_368);
LAB_0034cca8:
  uVar14 = (undefined1)uVar17;
  std::ifstream::~ifstream(local_308);
LAB_0034ccb5:
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  return (bool)uVar14;
}

Assistant:

bool HandleStringsCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("STRINGS requires a file name and output variable");
    return false;
  }

  // Get the file to read.
  std::string fileName = args[1];
  if (!cmsys::SystemTools::FileIsFullPath(fileName)) {
    fileName =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', args[1]);
  }

  // Get the variable in which to store the results.
  std::string const& outVar = args[2];

  // Parse the options.
  enum
  {
    arg_none,
    arg_limit_input,
    arg_limit_output,
    arg_limit_count,
    arg_length_minimum,
    arg_length_maximum,
    arg_maximum,
    arg_regex,
    arg_encoding
  };
  unsigned int minlen = 0;
  unsigned int maxlen = 0;
  int limit_input = -1;
  int limit_output = -1;
  unsigned int limit_count = 0;
  cmsys::RegularExpression regex;
  bool have_regex = false;
  bool newline_consume = false;
  bool hex_conversion_enabled = true;
  enum
  {
    encoding_none = cmsys::FStream::BOM_None,
    encoding_utf8 = cmsys::FStream::BOM_UTF8,
    encoding_utf16le = cmsys::FStream::BOM_UTF16LE,
    encoding_utf16be = cmsys::FStream::BOM_UTF16BE,
    encoding_utf32le = cmsys::FStream::BOM_UTF32LE,
    encoding_utf32be = cmsys::FStream::BOM_UTF32BE
  };
  int encoding = encoding_none;
  int arg_mode = arg_none;
  for (unsigned int i = 3; i < args.size(); ++i) {
    if (args[i] == "LIMIT_INPUT") {
      arg_mode = arg_limit_input;
    } else if (args[i] == "LIMIT_OUTPUT") {
      arg_mode = arg_limit_output;
    } else if (args[i] == "LIMIT_COUNT") {
      arg_mode = arg_limit_count;
    } else if (args[i] == "LENGTH_MINIMUM") {
      arg_mode = arg_length_minimum;
    } else if (args[i] == "LENGTH_MAXIMUM") {
      arg_mode = arg_length_maximum;
    } else if (args[i] == "REGEX") {
      arg_mode = arg_regex;
    } else if (args[i] == "NEWLINE_CONSUME") {
      newline_consume = true;
      arg_mode = arg_none;
    } else if (args[i] == "NO_HEX_CONVERSION") {
      hex_conversion_enabled = false;
      arg_mode = arg_none;
    } else if (args[i] == "ENCODING") {
      arg_mode = arg_encoding;
    } else if (arg_mode == arg_limit_input) {
      if (sscanf(args[i].c_str(), "%d", &limit_input) != 1 ||
          limit_input < 0) {
        status.SetError(cmStrCat("STRINGS option LIMIT_INPUT value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_output) {
      if (sscanf(args[i].c_str(), "%d", &limit_output) != 1 ||
          limit_output < 0) {
        status.SetError(cmStrCat("STRINGS option LIMIT_OUTPUT value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_count) {
      int count;
      if (sscanf(args[i].c_str(), "%d", &count) != 1 || count < 0) {
        status.SetError(cmStrCat("STRINGS option LIMIT_COUNT value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      limit_count = count;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_minimum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        status.SetError(cmStrCat("STRINGS option LENGTH_MINIMUM value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      minlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_maximum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        status.SetError(cmStrCat("STRINGS option LENGTH_MAXIMUM value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      maxlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_regex) {
      if (!regex.compile(args[i])) {
        status.SetError(cmStrCat("STRINGS option REGEX value \"", args[i],
                                 "\" could not be compiled."));
        return false;
      }
      have_regex = true;
      arg_mode = arg_none;
    } else if (arg_mode == arg_encoding) {
      if (args[i] == "UTF-8") {
        encoding = encoding_utf8;
      } else if (args[i] == "UTF-16LE") {
        encoding = encoding_utf16le;
      } else if (args[i] == "UTF-16BE") {
        encoding = encoding_utf16be;
      } else if (args[i] == "UTF-32LE") {
        encoding = encoding_utf32le;
      } else if (args[i] == "UTF-32BE") {
        encoding = encoding_utf32be;
      } else {
        status.SetError(cmStrCat("STRINGS option ENCODING \"", args[i],
                                 "\" not recognized."));
        return false;
      }
      arg_mode = arg_none;
    } else {
      status.SetError(
        cmStrCat("STRINGS given unknown argument \"", args[i], "\""));
      return false;
    }
  }

  if (hex_conversion_enabled) {
    // TODO: should work without temp file, but just on a memory buffer
    std::string binaryFileName =
      cmStrCat(status.GetMakefile().GetCurrentBinaryDirectory(),
               "/CMakeFiles/FileCommandStringsBinaryFile");
    if (cmHexFileConverter::TryConvert(fileName, binaryFileName)) {
      fileName = binaryFileName;
    }
  }

// Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(fileName.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(fileName.c_str());
#endif
  if (!fin) {
    status.SetError(
      cmStrCat("STRINGS file \"", fileName, "\" cannot be read."));
    return false;
  }

  // If BOM is found and encoding was not specified, use the BOM
  int bom_found = cmsys::FStream::ReadBOM(fin);
  if (encoding == encoding_none && bom_found != cmsys::FStream::BOM_None) {
    encoding = bom_found;
  }

  unsigned int bytes_rem = 0;
  if (encoding == encoding_utf16le || encoding == encoding_utf16be) {
    bytes_rem = 1;
  }
  if (encoding == encoding_utf32le || encoding == encoding_utf32be) {
    bytes_rem = 3;
  }

  // Parse strings out of the file.
  int output_size = 0;
  std::vector<std::string> strings;
  std::string s;
  while ((!limit_count || strings.size() < limit_count) &&
         (limit_input < 0 || static_cast<int>(fin.tellg()) < limit_input) &&
         fin) {
    std::string current_str;

    int c = fin.get();
    for (unsigned int i = 0; i < bytes_rem; ++i) {
      int c1 = fin.get();
      if (!fin) {
        fin.putback(static_cast<char>(c1));
        break;
      }
      c = (c << 8) | c1;
    }
    if (encoding == encoding_utf16le) {
      c = ((c & 0xFF) << 8) | ((c & 0xFF00) >> 8);
    } else if (encoding == encoding_utf32le) {
      c = (((c & 0xFF) << 24) | ((c & 0xFF00) << 8) | ((c & 0xFF0000) >> 8) |
           ((c & 0xFF000000) >> 24));
    }

    if (c == '\r') {
      // Ignore CR character to make output always have UNIX newlines.
      continue;
    }

    if (c >= 0 && c <= 0xFF &&
        (isprint(c) || c == '\t' || (c == '\n' && newline_consume))) {
      // This is an ASCII character that may be part of a string.
      // Cast added to avoid compiler warning. Cast is ok because
      // c is guaranteed to fit in char by the above if...
      current_str += static_cast<char>(c);
    } else if (encoding == encoding_utf8) {
      // Check for UTF-8 encoded string (up to 4 octets)
      static const unsigned char utf8_check_table[3][2] = {
        { 0xE0, 0xC0 },
        { 0xF0, 0xE0 },
        { 0xF8, 0xF0 },
      };

      // how many octets are there?
      unsigned int num_utf8_bytes = 0;
      for (unsigned int j = 0; num_utf8_bytes == 0 && j < 3; j++) {
        if ((c & utf8_check_table[j][0]) == utf8_check_table[j][1]) {
          num_utf8_bytes = j + 2;
        }
      }

      // get subsequent octets and check that they are valid
      for (unsigned int j = 0; j < num_utf8_bytes; j++) {
        if (j != 0) {
          c = fin.get();
          if (!fin || (c & 0xC0) != 0x80) {
            fin.putback(static_cast<char>(c));
            break;
          }
        }
        current_str += static_cast<char>(c);
      }

      // if this was an invalid utf8 sequence, discard the data, and put
      // back subsequent characters
      if ((current_str.length() != num_utf8_bytes)) {
        for (unsigned int j = 0; j < current_str.size() - 1; j++) {
          fin.putback(current_str[current_str.size() - 1 - j]);
        }
        current_str.clear();
      }
    }

    if (c == '\n' && !newline_consume) {
      // The current line has been terminated.  Check if the current
      // string matches the requirements.  The length may now be as
      // low as zero since blank lines are allowed.
      if (s.length() >= minlen && (!have_regex || regex.find(s))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s.clear();
    } else if (current_str.empty()) {
      // A non-string character has been found.  Check if the current
      // string matches the requirements.  We require that the length
      // be at least one no matter what the user specified.
      if (s.length() >= minlen && !s.empty() &&
          (!have_regex || regex.find(s))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s.clear();
    } else {
      s += current_str;
    }

    if (maxlen > 0 && s.size() == maxlen) {
      // Terminate a string if the maximum length is reached.
      if (s.length() >= minlen && (!have_regex || regex.find(s))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }
      s.clear();
    }
  }

  // If there is a non-empty current string we have hit the end of the
  // input file or the input size limit.  Check if the current string
  // matches the requirements.
  if ((!limit_count || strings.size() < limit_count) && !s.empty() &&
      s.length() >= minlen && (!have_regex || regex.find(s))) {
    output_size += static_cast<int>(s.size()) + 1;
    if (limit_output < 0 || output_size < limit_output) {
      strings.push_back(s);
    }
  }

  // Encode the result in a CMake list.
  const char* sep = "";
  std::string output;
  for (std::string const& sr : strings) {
    // Separate the strings in the output to make it a list.
    output += sep;
    sep = ";";

    // Store the string in the output, but escape semicolons to
    // make sure it is a list.
    for (char i : sr) {
      if (i == ';') {
        output += '\\';
      }
      output += i;
    }
  }

  // Save the output in a makefile variable.
  status.GetMakefile().AddDefinition(outVar, output);
  return true;
}